

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.h
# Opt level: O2

btScalar __thiscall
btCollisionWorld::ClosestRayResultCallback::addSingleResult
          (ClosestRayResultCallback *this,LocalRayResult *rayResult,bool normalInWorldSpace)

{
  btCollisionObject *pbVar1;
  undefined8 uVar2;
  undefined7 in_register_00000011;
  btVector3 bVar3;
  
  (this->super_RayResultCallback).m_closestHitFraction = rayResult->m_hitFraction;
  pbVar1 = rayResult->m_collisionObject;
  (this->super_RayResultCallback).m_collisionObject = pbVar1;
  if ((int)CONCAT71(in_register_00000011,normalInWorldSpace) == 0) {
    bVar3 = operator*(&(pbVar1->m_worldTransform).m_basis,&rayResult->m_hitNormalLocal);
    *&(this->m_hitNormalWorld).m_floats = bVar3.m_floats;
  }
  else {
    uVar2 = *(undefined8 *)((rayResult->m_hitNormalLocal).m_floats + 2);
    *(undefined8 *)(this->m_hitNormalWorld).m_floats =
         *(undefined8 *)(rayResult->m_hitNormalLocal).m_floats;
    *(undefined8 *)((this->m_hitNormalWorld).m_floats + 2) = uVar2;
  }
  btVector3::setInterpolate3
            (&this->m_hitPointWorld,&this->m_rayFromWorld,&this->m_rayToWorld,
             rayResult->m_hitFraction);
  return rayResult->m_hitFraction;
}

Assistant:

virtual	btScalar	addSingleResult(LocalRayResult& rayResult,bool normalInWorldSpace)
		{
			//caller already does the filter on the m_closestHitFraction
			btAssert(rayResult.m_hitFraction <= m_closestHitFraction);
			
			m_closestHitFraction = rayResult.m_hitFraction;
			m_collisionObject = rayResult.m_collisionObject;
			if (normalInWorldSpace)
			{
				m_hitNormalWorld = rayResult.m_hitNormalLocal;
			} else
			{
				///need to transform normal into worldspace
				m_hitNormalWorld = m_collisionObject->getWorldTransform().getBasis()*rayResult.m_hitNormalLocal;
			}
			m_hitPointWorld.setInterpolate3(m_rayFromWorld,m_rayToWorld,rayResult.m_hitFraction);
			return rayResult.m_hitFraction;
		}